

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

vec * cyclic_reduction(vec *__return_storage_ptr__,TridiagonalMatrix *m,vec *b)

{
  pointer *ppvVar1;
  allocator<double> *paVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  size_type sVar11;
  reference pvVar12;
  uint uVar13;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1c8;
  const_iterator local_1c0;
  int local_1b4;
  int local_1b0;
  int result_j_plus1;
  int result_j_minus1;
  int result_j;
  int coeff_j;
  int j;
  vec *rhs;
  vec *cs;
  vec *bs;
  vec *as;
  int local_178;
  uint i_1;
  int factor;
  undefined1 local_161;
  int local_160;
  int local_15c;
  int old_i;
  int i;
  vec *old_rhs;
  vec *old_c;
  vec *old_b;
  vec *old_a;
  value_type_conflict local_130;
  undefined1 local_128 [8];
  vec new_rhs;
  value_type_conflict local_108;
  undefined1 local_100 [8];
  vec new_c;
  value_type_conflict local_e0;
  undefined1 local_d8 [8];
  vec new_b;
  value_type_conflict local_b8;
  undefined1 local_b0 [8];
  vec new_a;
  undefined1 local_90 [4];
  int equation_count;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  rhs_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  c_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b_vecs;
  undefined1 local_38 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a_vecs;
  vec *b_local;
  TridiagonalMatrix *m_local;
  vec *result;
  
  a_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = b;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_38);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_38,&m->as);
  ppvVar1 = &c_vecs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)ppvVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)ppvVar1,&m->bs);
  ppvVar1 = &rhs_vecs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)ppvVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)ppvVar1,&m->cs);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_90);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_90,
              a_vecs.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = m->size;
  while (1 < new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_) {
    new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ / 2;
    sVar11 = (size_type)
             new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    local_b8 = 0.0;
    paVar2 = (allocator<double> *)
             ((long)&new_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar2);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_b0,sVar11,&local_b8,paVar2);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&new_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar11 = (size_type)
             new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    local_e0 = 0.0;
    paVar2 = (allocator<double> *)
             ((long)&new_c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar2);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_d8,sVar11,&local_e0,paVar2);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&new_c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar11 = (size_type)
             new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    local_108 = 0.0;
    paVar2 = (allocator<double> *)
             ((long)&new_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar2);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_100,sVar11,&local_108,paVar2);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&new_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar11 = (size_type)
             new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    local_130 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&old_a + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_128,sVar11,&local_130,
               (allocator<double> *)((long)&old_a + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&old_a + 7));
    old_b = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_38);
    old_c = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&c_vecs.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    old_rhs = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&rhs_vecs.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    _old_i = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)local_90);
    for (local_15c = 0;
        local_15c <
        new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_15c = local_15c + 1) {
      local_160 = local_15c * 2 + 1;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_b,(long)local_160);
      dVar3 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_c,(long)local_160);
      dVar4 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_rhs,(long)(local_160 + -1));
      dVar5 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + -1));
      dVar6 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_rhs,(long)local_160);
      dVar7 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_c,(long)(local_160 + 1));
      dVar8 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + 1));
      dVar9 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_b0,(long)local_15c);
      *pvVar12 = (dVar3 - (dVar4 * dVar5) / dVar6) - (dVar7 * dVar8) / dVar9;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_c,(long)(local_160 + -1));
      dVar3 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_c,(long)local_160);
      dVar4 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + -1));
      dVar5 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_d8,(long)local_15c);
      *pvVar12 = (-dVar3 * dVar4) / dVar5;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_rhs,(long)local_160);
      dVar3 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_rhs,(long)(local_160 + 1));
      dVar4 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + 1));
      dVar5 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_100,(long)local_15c);
      *pvVar12 = (-dVar3 * dVar4) / dVar5;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](_old_i,(long)local_160);
      dVar3 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (_old_i,(long)(local_160 + -1));
      dVar4 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_c,(long)local_160);
      dVar5 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + -1));
      dVar6 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (_old_i,(long)(local_160 + 1));
      dVar7 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](old_rhs,(long)local_160);
      dVar8 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (old_b,(long)(local_160 + 1));
      dVar9 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_128,(long)local_15c);
      *pvVar12 = (dVar3 - (dVar4 * dVar5) / dVar6) - (dVar7 * dVar8) / dVar9;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_38,(value_type *)local_b0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&c_vecs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&rhs_vecs.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_100);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_90,(value_type *)local_128);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_128);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_100);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_d8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_b0);
  }
  local_161 = 0;
  iVar10 = m->size;
  _factor = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&i_1 + 3));
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(iVar10 + 2),(value_type_conflict *)&factor,
             (allocator<double> *)((long)&i_1 + 3));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i_1 + 3));
  local_178 = m->size / 2 + 1;
  sVar11 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_38);
  as._4_4_ = (uint)sVar11;
  while (uVar13 = as._4_4_ - 1, as._4_4_ != 0) {
    as._4_4_ = uVar13;
    bs = std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_38,(ulong)uVar13);
    cs = std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&c_vecs.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)as._4_4_);
    rhs = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)&rhs_vecs.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)as._4_4_);
    _coeff_j = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_90,(ulong)as._4_4_);
    for (result_j = 1;
        result_j <
        new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ + 1; result_j = result_j + 2) {
      result_j_minus1 = result_j + -1;
      result_j_plus1 = result_j * local_178;
      local_1b0 = result_j_plus1 - local_178;
      local_1b4 = result_j_plus1 + local_178;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (_coeff_j,(long)result_j_minus1);
      dVar3 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](cs,(long)result_j_minus1);
      dVar4 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (__return_storage_ptr__,(long)local_1b0);
      dVar5 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](rhs,(long)result_j_minus1);
      dVar6 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (__return_storage_ptr__,(long)local_1b4);
      dVar7 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](bs,(long)result_j_minus1);
      dVar8 = *pvVar12;
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (__return_storage_ptr__,(long)result_j_plus1);
      *pvVar12 = (-dVar6 * dVar7 + -dVar4 * dVar5 + dVar3) / dVar8;
    }
    new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ * 2 + 1;
    local_178 = local_178 / 2;
  }
  as._4_4_ = uVar13;
  std::vector<double,_std::allocator<double>_>::pop_back(__return_storage_ptr__);
  local_1c8._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_1c0,&local_1c8);
  std::vector<double,_std::allocator<double>_>::erase(__return_storage_ptr__,local_1c0);
  local_161 = 1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_90);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&rhs_vecs.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&c_vecs.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

vec cyclic_reduction(const TridiagonalMatrix& m, const vec& b)
{
	std::vector<vec > a_vecs;
	a_vecs.push_back(m.as);
	std::vector<vec > b_vecs;
	b_vecs.push_back(m.bs);
	std::vector<vec > c_vecs;
	c_vecs.push_back(m.cs);
	std::vector<vec > rhs_vecs;
	rhs_vecs.push_back(b);
	int equation_count = m.size;

	while (equation_count > 1)
	{
		equation_count /= 2;
		vec new_a(equation_count, 0.0);
		vec new_b(equation_count, 0.0);
		vec new_c(equation_count, 0.0);
		vec new_rhs(equation_count, 0.0);
		vec& old_a = a_vecs.back();
		vec& old_b = b_vecs.back();
		vec& old_c = c_vecs.back();
		vec& old_rhs = rhs_vecs.back();

		for (int i = 0; i < equation_count; i++)
		{
			int old_i = 2 * i + 1;
			new_a[i] = old_a[old_i] -
				old_b[old_i] * old_c[old_i - 1] / old_a[old_i - 1] -
				old_c[old_i] * old_b[old_i + 1] / old_a[old_i + 1];
			new_b[i] = -old_b[old_i - 1] * old_b[old_i] / old_a[old_i - 1];
			new_c[i] = -old_c[old_i] * old_c[old_i + 1] / old_a[old_i + 1];
			new_rhs[i] = old_rhs[old_i] -
				old_rhs[old_i - 1] * old_b[old_i] / old_a[old_i - 1] -
				old_rhs[old_i + 1] * old_c[old_i] / old_a[old_i + 1];
		}

		a_vecs.push_back(new_a);
		b_vecs.push_back(new_b);
		c_vecs.push_back(new_c);
		rhs_vecs.push_back(new_rhs);
	}

	// result is padded with one zero one both sides to emulate
	// implicit variables x_0 and x_N
	vec result(m.size + 2, 0.0);
	// factor maps indices of equations in full system extended with x_0=0
	// and x_N=0 onto indices of equations in reduced extended system
	int factor = m.size / 2 + 1;
	for (unsigned int i = a_vecs.size(); i-- > 0;)
	{
		vec& as = a_vecs[i];
		vec& bs = b_vecs[i];
		vec& cs = c_vecs[i];
		vec& rhs = rhs_vecs[i];

		// j is an index of an equation in the reduced system extended with
		// x_0=0 and x_N=0
		for (int j = 1; j < equation_count + 1; j += 2)
		{
			// index in coefficents arrays is less by 1 since they don't
			// include x_0=0 and x_N=0 equations
			int coeff_j = j - 1;
			// mapping j to the index in the full extended system
			int result_j = j * factor;
			int result_j_minus1 = result_j - factor;
			int result_j_plus1 = result_j + factor;

			result[result_j] =
				(rhs[coeff_j] - bs[coeff_j] * result[result_j_minus1] -
				cs[coeff_j] * result[result_j_plus1]) / as[coeff_j];
		}

		equation_count = equation_count * 2 + 1;
		factor /= 2;
	}

	// drop the padding
	result.pop_back();
	result.erase(result.begin());

	return result;
}